

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_false>::change_branch_(DaTrie<true,_true,_false> *this,Query *query)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  pointer pBVar2;
  iterator iVar3;
  pointer pcVar4;
  char cVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte local_149;
  Bc local_148;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *local_140;
  Edge local_138;
  
  memset(&local_138,0,0x108);
  edge_(this,query->node_pos_,&local_138,2);
  if (local_138.size_ == 1) {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (uint)local_138.labels_[0] ^ *(uint *)(pBVar2 + query->node_pos_) & 0x7fffffff;
    local_148 = pBVar2[uVar8];
    if ((int)local_148._0_4_ < 0) {
      uVar9 = (ulong)(local_148._0_4_ & 0x7fffffff);
      local_140 = &this->blocks_;
      unfix_(this,uVar8,local_140);
      lVar10 = 0;
      while ((ulong)query->node_pos_ != 0) {
        uVar8 = *(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                          super__Vector_impl_data._M_start[query->node_pos_].field_0x4 & 0x7fffffff;
        sVar6 = edge_size_(this,uVar8,2);
        if (sVar6 != 1) break;
        delete_sib_(this,query->node_pos_);
        unfix_(this,query->node_pos_,local_140);
        query->node_pos_ = uVar8;
        query->is_finished_ = false;
        query->pos_ = query->pos_ - 1;
        lVar10 = lVar10 + 1;
      }
      pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = &this->tail_;
      pBVar2[query->node_pos_] =
           (Bc)(CONCAT44(*(undefined4 *)&pBVar2[query->node_pos_].field_0x4,
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) | 0x80000000);
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        iVar3._M_current =
             (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)this_00,iVar3,query->key_ + query->pos_);
        }
        else {
          *iVar3._M_current = query->key_[query->pos_];
          ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        uVar8 = query->pos_;
        query->pos_ = uVar8 + 1;
        query->is_finished_ = query->key_[uVar8] == '\0';
      }
      local_149 = local_138.labels_[0];
      iVar3._M_current =
           (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (this_00,iVar3,(char *)&local_149);
      }
      else {
        *iVar3._M_current = local_138.labels_[0];
        ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      if (local_138.labels_[0] == 0) {
        lVar10 = 4;
        do {
          local_149 = (byte)uVar9;
          iVar3._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (this_00,iVar3,(char *)&local_149);
          }
          else {
            *iVar3._M_current = local_149;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar9 = uVar9 >> 8;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      else {
        uVar8 = local_148._0_4_ & 0x7fffffff;
        pcVar4 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar7 = pcVar4 + uVar8;
        cVar5 = pcVar4[uVar8];
        while (cVar5 != '\0') {
          iVar3._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar3,pcVar7);
          }
          else {
            *iVar3._M_current = cVar5;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          this->tail_emps_ = this->tail_emps_ + 1;
          pcVar4 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar7 = pcVar4 + uVar9;
          cVar5 = pcVar4[uVar9];
        }
        iVar3._M_current =
             (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)this_00,iVar3,pcVar7);
        }
        else {
          *iVar3._M_current = '\0';
          ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        this->tail_emps_ = this->tail_emps_ + 1;
        lVar10 = 0;
        do {
          pcVar7 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + (uint)((int)lVar10 + (int)uVar9 + 1);
          iVar3._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar3,pcVar7);
          }
          else {
            *iVar3._M_current = *pcVar7;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          this->tail_emps_ = this->tail_emps_ + 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
      }
    }
  }
  return;
}

Assistant:

void change_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edge;
    edge_(query.node_pos(), edge, 2);

    if (edge.size() != 1) {
      return;
    }

    auto child_pos = bc_[query.node_pos()].base() ^*edge.begin();
    if (!bc_[child_pos].is_leaf()) {
      return;
    }

    auto value = bc_[child_pos].value();
    unfix_(child_pos, blocks_);

    size_t num_regress = 0;
    while (query.node_pos() != ROOT_POS) {
      auto parent_pos = bc_[query.node_pos()].check();
      if (edge_size_(parent_pos, 2) != 1) {
        break;
      }
      if (WithNLM) {
        delete_sib_(query.node_pos());
      }
      unfix_(query.node_pos(), blocks_);
      query.prev(parent_pos);
      ++num_regress;
    }

    bc_[query.node_pos()].set_value(tail_size());
    while (0 < num_regress--) {
      tail_.push_back(*query.key());
      query.next();
    }
    tail_.push_back(*edge.begin());

    if (*edge.begin() != '\0') {
      while (tail_[value] != '\0') {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
      tail_.push_back(tail_[value++]);
      ++tail_emps_;
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
    } else {
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(static_cast<uint8_t>(value & 0xFF));
        value >>= 8;
      }
    }
  }